

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::Normalize
          (SentencePieceNormalizer *this,string_view input,string *normalized)

{
  long *plVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  undefined8 uStack_190;
  undefined8 local_188;
  ios_base local_120 [272];
  
  plVar1 = *(long **)(input._M_len + 8);
  if (plVar1 == (long *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_190,"src/sentencepiece_trainer.cc",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_190,"(",1);
    std::ostream::operator<<((ostream *)&uStack_190,0x157);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_190,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_190,"normalizer_",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_190,"] ",2);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_190);
    std::ios_base::~ios_base(local_120);
  }
  else {
    uStack_190 = 0;
    local_188 = 0;
    (**(code **)(*plVar1 + 0x20))(this,plVar1,input._M_str);
  }
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::Normalize(absl::string_view input,
                                                std::string *normalized) const {
  CHECK_OR_RETURN(normalizer_);
  std::vector<size_t> norm_to_orig;
  return normalizer_->Normalize(input, normalized, &norm_to_orig);
}